

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O1

char * build_pax_attribute_name(char *dest,char *src)

{
  char cVar1;
  size_t sVar2;
  size_t src_length;
  char buff [64];
  char local_58 [64];
  
  if ((src == (char *)0x0) || (cVar1 = *src, cVar1 == '\0')) {
    builtin_strncpy(dest,"PaxHeader/blank",0x10);
    return dest;
  }
  sVar2 = strlen(src);
LAB_006c8803:
  do {
    src_length = sVar2;
    if (0 < (long)src_length) {
      sVar2 = src_length - 1;
      if (src[src_length - 1] == '/') goto LAB_006c8803;
    }
    if ((((long)src_length < 2) || (src[src_length - 1] != '.')) ||
       (sVar2 = src_length - 1, src[src_length - 2] != '/')) {
      if (src_length == 0) {
        builtin_strncpy(dest,"/PaxHeader/rootdir",0x13);
        return dest;
      }
      if (src_length == 1 && cVar1 == '.') {
        builtin_strncpy(dest,"PaxHeader/currentdir",0x15);
        return dest;
      }
      builtin_strncpy(local_58,"PaxHeader",10);
      build_ustar_entry_name(dest,src,src_length,local_58);
      return dest;
    }
  } while( true );
}

Assistant:

static char *
build_pax_attribute_name(char *dest, const char *src)
{
	char buff[64];
	const char *p;

	/* Handle the null filename case. */
	if (src == NULL || *src == '\0') {
		strcpy(dest, "PaxHeader/blank");
		return (dest);
	}

	/* Prune final '/' and other unwanted final elements. */
	p = src + strlen(src);
	for (;;) {
		/* Ends in "/", remove the '/' */
		if (p > src && p[-1] == '/') {
			--p;
			continue;
		}
		/* Ends in "/.", remove the '.' */
		if (p > src + 1 && p[-1] == '.'
		    && p[-2] == '/') {
			--p;
			continue;
		}
		break;
	}

	/* Pathological case: After above, there was nothing left.
	 * This includes "/." "/./." "/.//./." etc. */
	if (p == src) {
		strcpy(dest, "/PaxHeader/rootdir");
		return (dest);
	}

	/* Convert unadorned "." into a suitable filename. */
	if (*src == '.' && p == src + 1) {
		strcpy(dest, "PaxHeader/currentdir");
		return (dest);
	}

	/*
	 * TODO: Push this string into the 'pax' structure to avoid
	 * recomputing it every time.  That will also open the door
	 * to having clients override it.
	 */
#if HAVE_GETPID && 0  /* Disable this for now; see above comment. */
	snprintf(buff, sizeof(buff), "PaxHeader.%d", getpid());
#else
	/* If the platform can't fetch the pid, don't include it. */
	strcpy(buff, "PaxHeader");
#endif
	/* General case: build a ustar-compatible name adding
	 * "/PaxHeader/". */
	build_ustar_entry_name(dest, src, p - src, buff);

	return (dest);
}